

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

uint64 __thiscall google::protobuf::MapValueRef::GetUInt64Value(MapValueRef *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  CVar1 = type(this);
  if (CVar1 != CPPTYPE_UINT64) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.h"
               ,0x264);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"Protocol Buffer map usage error:\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"MapValueRef::GetUInt64Value");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," type does not match\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Expected : ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,(char *)0x391f3e);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Actual   : ");
    CVar1 = type(this);
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,*(char **)(FieldDescriptor::kCppTypeToName + (ulong)CVar1 * 8));
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return *this->data_;
}

Assistant:

uint64 GetUInt64Value() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_UINT64, "MapValueRef::GetUInt64Value");
    return *reinterpret_cast<uint64*>(data_);
  }